

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_common.h
# Opt level: O0

bool fast_float::fastfloat_strncasecmp<char>(char *input1,char *input2,size_t length)

{
  bool local_31;
  ulong local_30;
  size_t i;
  char running_diff;
  size_t length_local;
  char *input2_local;
  char *input1_local;
  
  i._7_1_ = 0;
  for (local_30 = 0; local_30 < length; local_30 = local_30 + 1) {
    i._7_1_ = i._7_1_ | input1[local_30] ^ input2[local_30];
  }
  local_31 = i._7_1_ == 0 || i._7_1_ == 0x20;
  return local_31;
}

Assistant:

inline FASTFLOAT_CONSTEXPR14 bool
fastfloat_strncasecmp(UC const * input1, UC const * input2, size_t length) {
  char running_diff{0};
  for (size_t i = 0; i < length; ++i) {
    running_diff |= (char(input1[i]) ^ char(input2[i]));
  }
  return (running_diff == 0) || (running_diff == 32);
}